

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlslangToSpv.cpp
# Opt level: O0

Id __thiscall
anon_unknown.dwarf_889438::TGlslangToSpvTraverser::convertGlslangToSpvType
          (TGlslangToSpvTraverser *this,TType *type,TLayoutPacking explicitLayout,
          TQualifier *qualifier,bool lastBufferBlockMember,bool forwardReferenceOnly)

{
  bool arrayed;
  bool ms;
  bool bVar1;
  bool bVar2;
  int iVar3;
  EShLanguage EVar4;
  Dim dim_00;
  ImageFormat format;
  uint uVar5;
  int rows_00;
  Id IVar6;
  Id IVar7;
  Id use_00;
  Id IVar8;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *psVar9;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  mapped_type_conflict *pmVar10;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  SpvVersion *pSVar11;
  mapped_type *pmVar12;
  mapped_type *__k;
  mapped_type *this_00;
  size_type __new_size;
  TSpirvType *pTVar13;
  TIntermConstantUnion *pTVar14;
  TConstUnionArray *pTVar15;
  TConstUnion *pTVar16;
  TString *this_01;
  TType *pTVar17;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  undefined4 extraout_var_14;
  undefined4 extraout_var_15;
  TArraySizes *pTVar18;
  undefined4 extraout_var_16;
  undefined4 extraout_var_17;
  undefined4 extraout_var_18;
  undefined4 extraout_var_19;
  char *pcVar19;
  double dVar20;
  int local_2dc;
  undefined1 local_2d8 [4];
  int dim_1;
  TType simpleArrayType;
  int stride;
  Id components;
  Id use;
  Id cols_1;
  Id rows_1;
  Id scope_1;
  Id cols;
  Id rows;
  Id scope;
  uint local_214;
  undefined1 local_210 [4];
  uint32_t i_1;
  vector<spv::IdImmediate,_std::allocator<spv::IdImmediate>_> operands_2;
  uint32_t dim;
  uint local_1ec;
  undefined1 local_1e8 [4];
  uint32_t i;
  vector<spv::IdImmediate,_std::allocator<spv::IdImmediate>_> operands_1;
  IdImmediate local_1c8;
  IdImmediate local_1c0;
  IdImmediate local_1b8;
  char local_1ad;
  uint local_1ac;
  char ch;
  char *pcStack_1a8;
  uint charCount;
  char *literalPtr;
  char *pcStack_198;
  uint literal_4;
  char *str;
  uint local_184;
  uint literal_3;
  uint local_178;
  uint literal_2;
  uint local_16c;
  uint literal_1;
  float local_160;
  float local_15c;
  uint literal;
  float floatValue;
  TIntermConstantUnion *constant;
  pair<unsigned_long,_Diligent::DynamicStaleResourceWrapper> *typeParam;
  const_iterator __end3;
  const_iterator __begin3;
  TSpirvTypeParameters *__range3;
  vector<spv::IdImmediate,_std::allocator<spv::IdImmediate>_> operands;
  TSpirvInstruction *spirvInst;
  TSpirvType *spirvType;
  TTypeList *glslangMembers;
  TSampler *sampler;
  Id local_ec;
  key_type pTStack_e8;
  Id referentType;
  key_type local_e0;
  Id local_d4;
  iterator iStack_d0;
  Id forwardId;
  key_type local_c8;
  _Self local_c0;
  _Self local_b8;
  allocator<char> local_a9;
  key_type local_a8;
  _Self local_88;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_80;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *extensions_1;
  allocator<char> local_69;
  key_type local_68;
  _Self local_48;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_40;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *extensions;
  Id spvType;
  bool forwardReferenceOnly_local;
  bool lastBufferBlockMember_local;
  TQualifier *qualifier_local;
  TType *pTStack_20;
  TLayoutPacking explicitLayout_local;
  TType *type_local;
  TGlslangToSpvTraverser *this_local;
  
  extensions._0_4_ = 0;
  extensions._6_1_ = forwardReferenceOnly;
  extensions._7_1_ = lastBufferBlockMember;
  _spvType = qualifier;
  qualifier_local._4_4_ = explicitLayout;
  pTStack_20 = type;
  type_local = (TType *)this;
  iVar3 = (*type->_vptr_TType[7])();
  switch(iVar3) {
  case 0:
    extensions._0_4_ = spv::Builder::makeVoidType(&this->builder);
    iVar3 = (*pTStack_20->_vptr_TType[0x1d])();
    if ((((byte)iVar3 ^ 0xff) & 1) == 0) {
      __assert_fail("! type.isArray()",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/GlslangToSpv.cpp"
                    ,0x1356,
                    "spv::Id (anonymous namespace)::TGlslangToSpvTraverser::convertGlslangToSpvType(const glslang::TType &, glslang::TLayoutPacking, const glslang::TQualifier &, bool, bool)"
                   );
    }
    break;
  case 1:
    extensions._0_4_ = spv::Builder::makeFloatType(&this->builder,0x20);
    break;
  case 2:
    extensions._0_4_ = spv::Builder::makeFloatType(&this->builder,0x40);
    break;
  case 3:
    extensions._0_4_ = spv::Builder::makeFloatType(&this->builder,0x10);
    break;
  case 4:
    extensions._0_4_ = spv::Builder::makeIntType(&this->builder,8);
    break;
  case 5:
    extensions._0_4_ = spv::Builder::makeUintType(&this->builder,8);
    break;
  case 6:
    extensions._0_4_ = spv::Builder::makeIntType(&this->builder,0x10);
    break;
  case 7:
    extensions._0_4_ = spv::Builder::makeUintType(&this->builder,0x10);
    break;
  case 8:
    extensions._0_4_ = spv::Builder::makeIntType(&this->builder,0x20);
    break;
  case 9:
    extensions._0_4_ = spv::Builder::makeUintType(&this->builder,0x20);
    break;
  case 10:
    extensions._0_4_ = spv::Builder::makeIntType(&this->builder,0x40);
    break;
  case 0xb:
    extensions._0_4_ = spv::Builder::makeUintType(&this->builder,0x40);
    break;
  case 0xc:
    if (qualifier_local._4_4_ == ElpNone) {
      extensions._0_4_ = spv::Builder::makeBoolType(&this->builder);
    }
    else {
      extensions._0_4_ = spv::Builder::makeUintType(&this->builder,0x20);
    }
    break;
  case 0xd:
    spv::Builder::addCapability(&this->builder,AtomicStorage);
    extensions._0_4_ = spv::Builder::makeUintType(&this->builder,0x20);
    break;
  case 0xe:
    iVar3 = (*pTStack_20->_vptr_TType[8])();
    glslangMembers = (TTypeList *)CONCAT44(extraout_var_04,iVar3);
    bVar2 = glslang::TSampler::isPureSampler((TSampler *)glslangMembers);
    if (bVar2) {
      extensions._0_4_ = spv::Builder::makeSamplerType(&this->builder);
    }
    else {
      IVar6 = getSampledType(this,(TSampler *)glslangMembers);
      dim_00 = TranslateDimensionality((TSampler *)glslangMembers);
      bVar2 = glslang::TSampler::isShadow((TSampler *)glslangMembers);
      arrayed = glslang::TSampler::isArrayed((TSampler *)glslangMembers);
      ms = glslang::TSampler::isMultiSample((TSampler *)glslangMembers);
      bVar1 = glslang::TSampler::isImageClass((TSampler *)glslangMembers);
      uVar5 = 1;
      if (bVar1) {
        uVar5 = 2;
      }
      format = TranslateImageFormat(this,pTStack_20);
      extensions._0_4_ =
           spv::Builder::makeImageType(&this->builder,IVar6,dim_00,bVar2,arrayed,ms,uVar5,format);
      bVar2 = glslang::TSampler::isCombined((TSampler *)glslangMembers);
      if ((bVar2) &&
         ((bVar2 = glslang::TSampler::isBuffer((TSampler *)glslangMembers), !bVar2 ||
          (pSVar11 = glslang::TIntermediate::getSpv(this->glslangIntermediate),
          pSVar11->spv < 0x10600)))) {
        extensions._0_4_ = spv::Builder::makeSampledImageType(&this->builder,(Id)extensions);
      }
    }
    break;
  case 0xf:
  case 0x10:
    spirvType = (TSpirvType *)glslang::TType::getStruct(pTStack_20);
    bVar2 = HasNonLayoutQualifiers(pTStack_20,_spvType);
    if (!bVar2) {
      pmVar12 = std::
                unordered_map<const_glslang::TVector<glslang::TTypeLoc>_*,_unsigned_int,_std::hash<const_glslang::TVector<glslang::TTypeLoc>_*>,_std::equal_to<const_glslang::TVector<glslang::TTypeLoc>_*>,_std::allocator<std::pair<const_glslang::TVector<glslang::TTypeLoc>_*const,_unsigned_int>_>_>
                ::operator[](this->structMap[qualifier_local._4_4_] +
                             (*(ulong *)&_spvType->field_0x8 >> 0x3d),(key_type *)&spirvType);
      extensions._0_4_ = *pmVar12;
    }
    if ((Id)extensions == 0) {
      iVar3 = (*pTStack_20->_vptr_TType[7])();
      if (iVar3 == 0x10) {
        __k = std::
              unordered_map<const_glslang::TVector<glslang::TTypeLoc>_*,_long_long,_std::hash<const_glslang::TVector<glslang::TTypeLoc>_*>,_std::equal_to<const_glslang::TVector<glslang::TTypeLoc>_*>,_std::allocator<std::pair<const_glslang::TVector<glslang::TTypeLoc>_*const,_long_long>_>_>
              ::operator[](&this->glslangTypeToIdMap,(key_type *)&spirvType);
        this_00 = std::
                  unordered_map<long_long,_std::vector<int,_std::allocator<int>_>,_std::hash<long_long>,_std::equal_to<long_long>,_std::allocator<std::pair<const_long_long,_std::vector<int,_std::allocator<int>_>_>_>_>
                  ::operator[](&this->memberRemapper,__k);
        __new_size = std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>::
                     size((vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_> *)
                          spirvType);
        std::vector<int,_std::allocator<int>_>::resize(this_00,__new_size);
      }
      extensions._0_4_ =
           convertGlslangStructToSpvType
                     (this,pTStack_20,(TTypeList *)spirvType,qualifier_local._4_4_,_spvType);
    }
    break;
  case 0x11:
    EVar4 = glslang::TIntermediate::getStage(this->glslangIntermediate);
    if (5 < EVar4 - EShLangRayGen) {
      psVar9 = glslang::TIntermediate::getRequestedExtensions_abi_cxx11_(this->glslangIntermediate);
      local_40 = psVar9;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_68,"GL_EXT_ray_query",&local_69);
      local_48._M_node =
           (_Base_ptr)
           std::
           set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::find(psVar9,&local_68);
      extensions_1 = (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)std::
                        set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::end(local_40);
      bVar2 = std::operator!=(&local_48,(_Self *)&extensions_1);
      std::__cxx11::string::~string((string *)&local_68);
      std::allocator<char>::~allocator(&local_69);
      if (bVar2) {
        spv::Builder::addExtension(&this->builder,"SPV_KHR_ray_query");
        spv::Builder::addCapability(&this->builder,CapabilityRayQueryKHR);
      }
    }
    extensions._0_4_ = spv::Builder::makeAccelerationStructureType(&this->builder);
    break;
  case 0x12:
    iVar3 = (*pTStack_20->_vptr_TType[0x15])();
    local_c8 = (key_type)CONCAT44(extraout_var,iVar3);
    local_c0._M_node =
         (_Base_ptr)
         std::
         map<const_glslang::TType_*,_unsigned_int,_std::less<const_glslang::TType_*>,_std::allocator<std::pair<const_glslang::TType_*const,_unsigned_int>_>_>
         ::find(&this->forwardPointers,&local_c8);
    iStack_d0 = std::
                map<const_glslang::TType_*,_unsigned_int,_std::less<const_glslang::TType_*>,_std::allocator<std::pair<const_glslang::TType_*const,_unsigned_int>_>_>
                ::end(&this->forwardPointers);
    bVar2 = std::operator==(&local_c0,&stack0xffffffffffffff30);
    if (bVar2) {
      IVar6 = spv::Builder::makeForwardPointer(&this->builder,PhysicalStorageBuffer);
      local_d4 = IVar6;
      iVar3 = (*pTStack_20->_vptr_TType[0x15])();
      local_e0 = (key_type)CONCAT44(extraout_var_00,iVar3);
      pmVar10 = std::
                map<const_glslang::TType_*,_unsigned_int,_std::less<const_glslang::TType_*>,_std::allocator<std::pair<const_glslang::TType_*const,_unsigned_int>_>_>
                ::operator[](&this->forwardPointers,&local_e0);
      *pmVar10 = IVar6;
    }
    iVar3 = (*pTStack_20->_vptr_TType[0x15])();
    pTStack_e8 = (key_type)CONCAT44(extraout_var_01,iVar3);
    pmVar10 = std::
              map<const_glslang::TType_*,_unsigned_int,_std::less<const_glslang::TType_*>,_std::allocator<std::pair<const_glslang::TType_*const,_unsigned_int>_>_>
              ::operator[](&this->forwardPointers,&stack0xffffffffffffff18);
    extensions._0_4_ = *pmVar10;
    if ((extensions._6_1_ & 1) == 0) {
      iVar3 = (*pTStack_20->_vptr_TType[0x15])();
      local_ec = convertGlslangToSpvType(this,(TType *)CONCAT44(extraout_var_02,iVar3),false);
      iVar3 = (*pTStack_20->_vptr_TType[0x15])();
      sampler = (TSampler *)CONCAT44(extraout_var_03,iVar3);
      pmVar10 = std::
                map<const_glslang::TType_*,_unsigned_int,_std::less<const_glslang::TType_*>,_std::allocator<std::pair<const_glslang::TType_*const,_unsigned_int>_>_>
                ::operator[](&this->forwardPointers,(key_type *)&sampler);
      spv::Builder::makePointerFromForwardPointer
                (&this->builder,PhysicalStorageBuffer,*pmVar10,local_ec);
    }
    break;
  case 0x13:
    psVar9 = glslang::TIntermediate::getRequestedExtensions_abi_cxx11_(this->glslangIntermediate);
    local_80 = psVar9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a8,"GL_EXT_ray_query",&local_a9);
    local_88._M_node =
         (_Base_ptr)
         std::
         set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::find(psVar9,&local_a8);
    local_b8._M_node =
         (_Base_ptr)
         std::
         set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end(local_80);
    bVar2 = std::operator!=(&local_88,&local_b8);
    std::__cxx11::string::~string((string *)&local_a8);
    std::allocator<char>::~allocator(&local_a9);
    if (bVar2) {
      spv::Builder::addExtension(&this->builder,"SPV_KHR_ray_query");
      spv::Builder::addCapability(&this->builder,CapabilityRayQueryKHR);
    }
    extensions._0_4_ = spv::Builder::makeRayQueryType(&this->builder);
    break;
  case 0x14:
    spv::Builder::addExtension(&this->builder,"SPV_NV_shader_invocation_reorder");
    spv::Builder::addCapability(&this->builder,CapabilityShaderInvocationReorderNV);
    extensions._0_4_ = spv::Builder::makeHitObjectNVType(&this->builder);
    break;
  default:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/GlslangToSpv.cpp"
                  ,0x1442,
                  "spv::Id (anonymous namespace)::TGlslangToSpvTraverser::convertGlslangToSpvType(const glslang::TType &, glslang::TLayoutPacking, const glslang::TQualifier &, bool, bool)"
                 );
  case 0x17:
    spv::Builder::addCapability(&this->builder,CapabilityTensorAddressingNV);
    spv::Builder::addExtension(&this->builder,"SPV_NV_tensor_addressing");
    std::vector<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>::vector
              ((vector<spv::IdImmediate,_std::allocator<spv::IdImmediate>_> *)local_1e8);
    for (local_1ec = 0; local_1ec < 2; local_1ec = local_1ec + 1) {
      iVar3 = (*pTStack_20->_vptr_TType[0x16])();
      IVar6 = makeArraySizeId(this,*(TArraySizes **)(CONCAT44(extraout_var_05,iVar3) + 8),local_1ec,
                              true,false);
      spv::IdImmediate::IdImmediate
                ((IdImmediate *)
                 ((long)&operands_2.
                         super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage + 4),true,IVar6);
      std::vector<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>::push_back
                ((vector<spv::IdImmediate,_std::allocator<spv::IdImmediate>_> *)local_1e8,
                 (value_type *)
                 ((long)&operands_2.
                         super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage + 4));
    }
    extensions._0_4_ =
         spv::Builder::makeGenericType
                   (&this->builder,OpTypeTensorLayoutNV,
                    (vector<spv::IdImmediate,_std::allocator<spv::IdImmediate>_> *)local_1e8);
    std::vector<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>::~vector
              ((vector<spv::IdImmediate,_std::allocator<spv::IdImmediate>_> *)local_1e8);
    break;
  case 0x18:
    spv::Builder::addCapability(&this->builder,CapabilityTensorAddressingNV);
    spv::Builder::addExtension(&this->builder,"SPV_NV_tensor_addressing");
    iVar3 = (*pTStack_20->_vptr_TType[0x16])();
    operands_2.super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._0_4_ =
         glslang::TArraySizes::getDimSize(*(TArraySizes **)(CONCAT44(extraout_var_06,iVar3) + 8),0);
    if ((uint)operands_2.super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage == 0 ||
        5 < (uint)operands_2.super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      __assert_fail("dim >= 1 && dim <= 5",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/GlslangToSpv.cpp"
                    ,0x1439,
                    "spv::Id (anonymous namespace)::TGlslangToSpvTraverser::convertGlslangToSpvType(const glslang::TType &, glslang::TLayoutPacking, const glslang::TQualifier &, bool, bool)"
                   );
    }
    std::vector<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>::vector
              ((vector<spv::IdImmediate,_std::allocator<spv::IdImmediate>_> *)local_210);
    for (local_214 = 0;
        local_214 <
        (uint)operands_2.super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage + 2; local_214 = local_214 + 1) {
      iVar3 = (*pTStack_20->_vptr_TType[0x16])();
      IVar6 = makeArraySizeId(this,*(TArraySizes **)(CONCAT44(extraout_var_07,iVar3) + 8),local_214,
                              true,local_214 == 1);
      spv::IdImmediate::IdImmediate((IdImmediate *)&rows,true,IVar6);
      std::vector<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>::push_back
                ((vector<spv::IdImmediate,_std::allocator<spv::IdImmediate>_> *)local_210,
                 (value_type *)&rows);
    }
    extensions._0_4_ =
         spv::Builder::makeGenericType
                   (&this->builder,OpTypeTensorViewNV,
                    (vector<spv::IdImmediate,_std::allocator<spv::IdImmediate>_> *)local_210);
    std::vector<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>::~vector
              ((vector<spv::IdImmediate,_std::allocator<spv::IdImmediate>_> *)local_210);
    break;
  case 0x1a:
    pTVar13 = glslang::TType::getSpirvType(pTStack_20);
    operands.super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)pTVar13;
    std::vector<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>::vector
              ((vector<spv::IdImmediate,_std::allocator<spv::IdImmediate>_> *)&__range3);
    __end3 = std::
             vector<glslang::TSpirvTypeParameter,_glslang::pool_allocator<glslang::TSpirvTypeParameter>_>
             ::begin(&(pTVar13->typeParams).
                      super_vector<glslang::TSpirvTypeParameter,_glslang::pool_allocator<glslang::TSpirvTypeParameter>_>
                    );
    typeParam = (pair<unsigned_long,_Diligent::DynamicStaleResourceWrapper> *)
                std::
                vector<glslang::TSpirvTypeParameter,_glslang::pool_allocator<glslang::TSpirvTypeParameter>_>
                ::end(&(pTVar13->typeParams).
                       super_vector<glslang::TSpirvTypeParameter,_glslang::pool_allocator<glslang::TSpirvTypeParameter>_>
                     );
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end3,(__normal_iterator<const_glslang::TSpirvTypeParameter_*,_std::vector<glslang::TSpirvTypeParameter,_glslang::pool_allocator<glslang::TSpirvTypeParameter>_>_>
                                       *)&typeParam), bVar2) {
      constant = (TIntermConstantUnion *)
                 __gnu_cxx::
                 __normal_iterator<const_glslang::TSpirvTypeParameter_*,_std::vector<glslang::TSpirvTypeParameter,_glslang::pool_allocator<glslang::TSpirvTypeParameter>_>_>
                 ::operator*(&__end3);
      pTVar14 = glslang::TSpirvTypeParameter::getAsConstant((TSpirvTypeParameter *)constant);
      if (pTVar14 == (TIntermConstantUnion *)0x0) {
        pTVar17 = glslang::TSpirvTypeParameter::getAsType((TSpirvTypeParameter *)constant);
        if (pTVar17 == (TType *)0x0) {
          __assert_fail("typeParam.getAsType() != nullptr",
                        "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/GlslangToSpv.cpp"
                        ,0x141d,
                        "spv::Id (anonymous namespace)::TGlslangToSpvTraverser::convertGlslangToSpvType(const glslang::TType &, glslang::TLayoutPacking, const glslang::TQualifier &, bool, bool)"
                       );
        }
        pTVar17 = glslang::TSpirvTypeParameter::getAsType((TSpirvTypeParameter *)constant);
        IVar6 = convertGlslangToSpvType(this,pTVar17,false);
        spv::IdImmediate::IdImmediate
                  ((IdImmediate *)
                   &operands_1.
                    super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,true,IVar6);
        std::vector<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>::push_back
                  ((vector<spv::IdImmediate,_std::allocator<spv::IdImmediate>_> *)&__range3,
                   (value_type *)
                   &operands_1.
                    super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
      }
      else {
        _literal = glslang::TSpirvTypeParameter::getAsConstant((TSpirvTypeParameter *)constant);
        bVar2 = glslang::TIntermConstantUnion::isLiteral(_literal);
        if (bVar2) {
          iVar3 = (*(_literal->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x20])();
          if (iVar3 == 1) {
            pTVar15 = glslang::TIntermConstantUnion::getConstArray(_literal);
            pTVar16 = glslang::TConstUnionArray::operator[](pTVar15,0);
            dVar20 = glslang::TConstUnion::getDConst(pTVar16);
            local_160 = (float)dVar20;
            local_15c = local_160;
            spv::IdImmediate::IdImmediate
                      ((IdImmediate *)&stack0xfffffffffffffe98,false,(uint)local_160);
            std::vector<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>::push_back
                      ((vector<spv::IdImmediate,_std::allocator<spv::IdImmediate>_> *)&__range3,
                       (value_type *)&stack0xfffffffffffffe98);
          }
          else {
            iVar3 = (*(_literal->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x20])();
            if (iVar3 == 8) {
              pTVar15 = glslang::TIntermConstantUnion::getConstArray(_literal);
              pTVar16 = glslang::TConstUnionArray::operator[](pTVar15,0);
              local_16c = glslang::TConstUnion::getIConst(pTVar16);
              spv::IdImmediate::IdImmediate((IdImmediate *)&stack0xfffffffffffffe8c,false,local_16c)
              ;
              std::vector<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>::push_back
                        ((vector<spv::IdImmediate,_std::allocator<spv::IdImmediate>_> *)&__range3,
                         (value_type *)&stack0xfffffffffffffe8c);
            }
            else {
              iVar3 = (*(_literal->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x20])();
              if (iVar3 == 9) {
                pTVar15 = glslang::TIntermConstantUnion::getConstArray(_literal);
                pTVar16 = glslang::TConstUnionArray::operator[](pTVar15,0);
                local_178 = glslang::TConstUnion::getUConst(pTVar16);
                spv::IdImmediate::IdImmediate
                          ((IdImmediate *)&stack0xfffffffffffffe80,false,local_178);
                std::vector<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>::push_back
                          ((vector<spv::IdImmediate,_std::allocator<spv::IdImmediate>_> *)&__range3,
                           (value_type *)&stack0xfffffffffffffe80);
              }
              else {
                iVar3 = (*(_literal->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x20])
                                  ();
                if (iVar3 == 0xc) {
                  pTVar15 = glslang::TIntermConstantUnion::getConstArray(_literal);
                  pTVar16 = glslang::TConstUnionArray::operator[](pTVar15,0);
                  bVar2 = glslang::TConstUnion::getBConst(pTVar16);
                  local_184 = (uint)bVar2;
                  spv::IdImmediate::IdImmediate((IdImmediate *)((long)&str + 4),false,local_184);
                  std::vector<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>::push_back
                            ((vector<spv::IdImmediate,_std::allocator<spv::IdImmediate>_> *)
                             &__range3,(value_type *)((long)&str + 4));
                }
                else {
                  iVar3 = (*(_literal->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x20]
                          )();
                  if (iVar3 != 0x1b) {
                    __assert_fail("0",
                                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/GlslangToSpv.cpp"
                                  ,0x1418,
                                  "spv::Id (anonymous namespace)::TGlslangToSpvTraverser::convertGlslangToSpvType(const glslang::TType &, glslang::TLayoutPacking, const glslang::TQualifier &, bool, bool)"
                                 );
                  }
                  pTVar15 = glslang::TIntermConstantUnion::getConstArray(_literal);
                  pTVar16 = glslang::TConstUnionArray::operator[](pTVar15,0);
                  this_01 = glslang::TConstUnion::getSConst_abi_cxx11_(pTVar16);
                  pcStack_198 = std::__cxx11::
                                basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                ::c_str(this_01);
                  literalPtr._4_4_ = 0;
                  pcStack_1a8 = (char *)((long)&literalPtr + 4);
                  local_1ac = 0;
                  do {
                    local_1ad = *pcStack_198;
                    pcVar19 = pcStack_1a8 + 1;
                    pcStack_198 = pcStack_198 + 1;
                    *pcStack_1a8 = local_1ad;
                    local_1ac = local_1ac + 1;
                    pcStack_1a8 = pcVar19;
                    if (local_1ac == 4) {
                      spv::IdImmediate::IdImmediate(&local_1b8,false,literalPtr._4_4_);
                      std::vector<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>::push_back
                                ((vector<spv::IdImmediate,_std::allocator<spv::IdImmediate>_> *)
                                 &__range3,&local_1b8);
                      pcStack_1a8 = (char *)((long)&literalPtr + 4);
                      local_1ac = 0;
                    }
                  } while (local_1ad != '\0');
                  if (local_1ac != 0) {
                    for (; local_1ac < 4; local_1ac = local_1ac + 1) {
                      *pcStack_1a8 = '\0';
                      pcStack_1a8 = pcStack_1a8 + 1;
                    }
                    spv::IdImmediate::IdImmediate(&local_1c0,false,literalPtr._4_4_);
                    std::vector<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>::push_back
                              ((vector<spv::IdImmediate,_std::allocator<spv::IdImmediate>_> *)
                               &__range3,&local_1c0);
                  }
                }
              }
            }
          }
        }
        else {
          IVar6 = createSpvConstant(this,&_literal->super_TIntermTyped);
          spv::IdImmediate::IdImmediate(&local_1c8,true,IVar6);
          std::vector<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>::push_back
                    ((vector<spv::IdImmediate,_std::allocator<spv::IdImmediate>_> *)&__range3,
                     &local_1c8);
        }
      }
      __gnu_cxx::
      __normal_iterator<const_glslang::TSpirvTypeParameter_*,_std::vector<glslang::TSpirvTypeParameter,_glslang::pool_allocator<glslang::TSpirvTypeParameter>_>_>
      ::operator++(&__end3);
    }
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                             *)operands.
                               super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,"");
    if (!bVar2) {
      __assert_fail("spirvInst.set == \"\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/GlslangToSpv.cpp"
                    ,0x1422,
                    "spv::Id (anonymous namespace)::TGlslangToSpvTraverser::convertGlslangToSpvType(const glslang::TType &, glslang::TLayoutPacking, const glslang::TQualifier &, bool, bool)"
                   );
    }
    extensions._0_4_ =
         spv::Builder::makeGenericType
                   (&this->builder,
                    *(Op *)(operands.
                            super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage + 5),
                    (vector<spv::IdImmediate,_std::allocator<spv::IdImmediate>_> *)&__range3);
    std::vector<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>::~vector
              ((vector<spv::IdImmediate,_std::allocator<spv::IdImmediate>_> *)&__range3);
    break;
  case 0x1b:
    return 0;
  }
  uVar5 = (*pTStack_20->_vptr_TType[0x1c])();
  IVar6 = (Id)extensions;
  if ((uVar5 & 1) == 0) {
    iVar3 = (*pTStack_20->_vptr_TType[0xc])();
    IVar6 = (Id)extensions;
    if (1 < iVar3) {
      iVar3 = (*pTStack_20->_vptr_TType[0xc])();
      extensions._0_4_ = spv::Builder::makeVectorType(&this->builder,IVar6,iVar3);
    }
  }
  else {
    iVar3 = (*pTStack_20->_vptr_TType[0xd])();
    rows_00 = (*pTStack_20->_vptr_TType[0xe])();
    extensions._0_4_ = spv::Builder::makeMatrixType(&this->builder,IVar6,iVar3,rows_00);
  }
  bVar2 = glslang::TType::isCoopMatNV(pTStack_20);
  if (bVar2) {
    spv::Builder::addCapability(&this->builder,CapabilityCooperativeMatrixNV);
    spv::Builder::addExtension(&this->builder,"SPV_NV_cooperative_matrix");
    iVar3 = (*pTStack_20->_vptr_TType[7])();
    if (iVar3 == 3) {
      spv::Builder::addCapability(&this->builder,CapabilityFloat16);
    }
    iVar3 = (*pTStack_20->_vptr_TType[7])();
    if ((iVar3 == 5) || (iVar3 = (*pTStack_20->_vptr_TType[7])(), iVar3 == 4)) {
      spv::Builder::addCapability(&this->builder,CapabilityInt8);
    }
    iVar3 = (*pTStack_20->_vptr_TType[0x16])();
    IVar6 = makeArraySizeId(this,*(TArraySizes **)(CONCAT44(extraout_var_08,iVar3) + 8),1,false,
                            false);
    iVar3 = (*pTStack_20->_vptr_TType[0x16])();
    IVar8 = makeArraySizeId(this,*(TArraySizes **)(CONCAT44(extraout_var_09,iVar3) + 8),2,false,
                            false);
    iVar3 = (*pTStack_20->_vptr_TType[0x16])();
    IVar7 = makeArraySizeId(this,*(TArraySizes **)(CONCAT44(extraout_var_10,iVar3) + 8),3,false,
                            false);
    extensions._0_4_ =
         spv::Builder::makeCooperativeMatrixTypeNV(&this->builder,(Id)extensions,IVar6,IVar8,IVar7);
  }
  bVar2 = glslang::TType::isCoopMatKHR(pTStack_20);
  if (bVar2) {
    spv::Builder::addCapability(&this->builder,CapabilityCooperativeMatrixKHR);
    spv::Builder::addExtension(&this->builder,"SPV_KHR_cooperative_matrix");
    iVar3 = (*pTStack_20->_vptr_TType[7])();
    if (iVar3 == 3) {
      spv::Builder::addCapability(&this->builder,CapabilityFloat16);
    }
    iVar3 = (*pTStack_20->_vptr_TType[7])();
    if ((iVar3 == 5) || (iVar3 = (*pTStack_20->_vptr_TType[7])(), iVar3 == 4)) {
      spv::Builder::addCapability(&this->builder,CapabilityInt8);
    }
    iVar3 = (*pTStack_20->_vptr_TType[0x16])();
    IVar6 = makeArraySizeId(this,*(TArraySizes **)(CONCAT44(extraout_var_11,iVar3) + 8),0,false,
                            false);
    iVar3 = (*pTStack_20->_vptr_TType[0x16])();
    IVar8 = makeArraySizeId(this,*(TArraySizes **)(CONCAT44(extraout_var_12,iVar3) + 8),1,false,
                            false);
    iVar3 = (*pTStack_20->_vptr_TType[0x16])();
    IVar7 = makeArraySizeId(this,*(TArraySizes **)(CONCAT44(extraout_var_13,iVar3) + 8),2,false,
                            false);
    uVar5 = glslang::TType::getCoopMatKHRuse(pTStack_20);
    use_00 = spv::Builder::makeUintConstant(&this->builder,uVar5,false);
    extensions._0_4_ =
         spv::Builder::makeCooperativeMatrixTypeKHR
                   (&this->builder,(Id)extensions,IVar6,IVar8,IVar7,use_00);
  }
  bVar2 = glslang::TType::isCoopVecNV(pTStack_20);
  if (bVar2) {
    spv::Builder::addCapability(&this->builder,CapabilityCooperativeVectorNV);
    spv::Builder::addExtension(&this->builder,"SPV_NV_cooperative_vector");
    iVar3 = (*pTStack_20->_vptr_TType[7])();
    if (iVar3 == 3) {
      spv::Builder::addCapability(&this->builder,CapabilityFloat16);
    }
    iVar3 = (*pTStack_20->_vptr_TType[7])();
    if ((iVar3 == 5) || (iVar3 = (*pTStack_20->_vptr_TType[7])(), iVar3 == 4)) {
      spv::Builder::addCapability(&this->builder,CapabilityInt8);
    }
    iVar3 = (*pTStack_20->_vptr_TType[0x16])();
    simpleArrayType.spirvType._4_4_ =
         makeArraySizeId(this,*(TArraySizes **)(CONCAT44(extraout_var_14,iVar3) + 8),0,false,false);
    extensions._0_4_ =
         spv::Builder::makeCooperativeVectorTypeNV
                   (&this->builder,(Id)extensions,simpleArrayType.spirvType._4_4_);
  }
  uVar5 = (*pTStack_20->_vptr_TType[0x1d])();
  if ((uVar5 & 1) != 0) {
    simpleArrayType.spirvType._0_4_ = 0;
    iVar3 = (*pTStack_20->_vptr_TType[0x13])();
    iVar3 = glslang::TArraySizes::getNumDims((TArraySizes *)CONCAT44(extraout_var_15,iVar3));
    if (iVar3 < 2) {
      if ((qualifier_local._4_4_ != ElpNone) &&
         (iVar3 = (*pTStack_20->_vptr_TType[7])(), iVar3 != 0x10)) {
        simpleArrayType.spirvType._0_4_ =
             getArrayStride(this,pTStack_20,qualifier_local._4_4_,
                            (TLayoutMatrix)((ulong)*(undefined8 *)&_spvType->field_0x8 >> 0x3d));
      }
    }
    else {
      if ((qualifier_local._4_4_ != ElpNone) &&
         (iVar3 = (*pTStack_20->_vptr_TType[7])(), iVar3 != 0x10)) {
        glslang::TType::TType((TType *)local_2d8,pTStack_20,0,false);
        while( true ) {
          pTVar18 = glslang::TType::getArraySizes((TType *)local_2d8);
          iVar3 = glslang::TArraySizes::getNumDims(pTVar18);
          if (iVar3 < 2) break;
          pTVar18 = glslang::TType::getArraySizes((TType *)local_2d8);
          glslang::TArraySizes::dereference(pTVar18);
        }
        simpleArrayType.spirvType._0_4_ =
             getArrayStride(this,(TType *)local_2d8,qualifier_local._4_4_,
                            (TLayoutMatrix)((ulong)*(undefined8 *)&_spvType->field_0x8 >> 0x3d));
        glslang::TType::~TType((TType *)local_2d8);
      }
      iVar3 = (*pTStack_20->_vptr_TType[0x13])();
      local_2dc = glslang::TArraySizes::getNumDims((TArraySizes *)CONCAT44(extraout_var_16,iVar3));
      while (IVar6 = (Id)extensions, local_2dc = local_2dc + -1, 0 < local_2dc) {
        iVar3 = (*pTStack_20->_vptr_TType[0x13])();
        IVar8 = makeArraySizeId(this,(TArraySizes *)CONCAT44(extraout_var_17,iVar3),local_2dc,false,
                                false);
        extensions._0_4_ =
             spv::Builder::makeArrayType(&this->builder,IVar6,IVar8,(int)simpleArrayType.spirvType);
        if (0 < (int)simpleArrayType.spirvType) {
          spv::Builder::addDecoration
                    (&this->builder,(Id)extensions,ArrayStride,(int)simpleArrayType.spirvType);
        }
        iVar3 = (*pTStack_20->_vptr_TType[0x13])();
        iVar3 = glslang::TArraySizes::getDimSize
                          ((TArraySizes *)CONCAT44(extraout_var_18,iVar3),local_2dc);
        simpleArrayType.spirvType._0_4_ = iVar3 * (int)simpleArrayType.spirvType;
      }
    }
    uVar5 = (*pTStack_20->_vptr_TType[0x1e])();
    IVar6 = (Id)extensions;
    if ((uVar5 & 1) == 0) {
      if ((extensions._7_1_ & 1) == 0) {
        spv::Builder::addIncorporatedExtension(&this->builder,"SPV_EXT_descriptor_indexing",Spv_1_5)
        ;
        spv::Builder::addCapability(&this->builder,CapabilityRuntimeDescriptorArray);
      }
      extensions._0_4_ = spv::Builder::makeRuntimeArray(&this->builder,(Id)extensions);
    }
    else {
      iVar3 = (*pTStack_20->_vptr_TType[0x13])();
      IVar8 = makeArraySizeId(this,(TArraySizes *)CONCAT44(extraout_var_19,iVar3),0,false,false);
      extensions._0_4_ =
           spv::Builder::makeArrayType(&this->builder,IVar6,IVar8,(int)simpleArrayType.spirvType);
    }
    if (0 < (int)simpleArrayType.spirvType) {
      spv::Builder::addDecoration
                (&this->builder,(Id)extensions,ArrayStride,(int)simpleArrayType.spirvType);
    }
  }
  return (Id)extensions;
}

Assistant:

spv::Id TGlslangToSpvTraverser::convertGlslangToSpvType(const glslang::TType& type,
    glslang::TLayoutPacking explicitLayout, const glslang::TQualifier& qualifier,
    bool lastBufferBlockMember, bool forwardReferenceOnly)
{
    spv::Id spvType = spv::NoResult;

    switch (type.getBasicType()) {
    case glslang::EbtVoid:
        spvType = builder.makeVoidType();
        assert (! type.isArray());
        break;
    case glslang::EbtBool:
        // "transparent" bool doesn't exist in SPIR-V.  The GLSL convention is
        // a 32-bit int where non-0 means true.
        if (explicitLayout != glslang::ElpNone)
            spvType = builder.makeUintType(32);
        else
            spvType = builder.makeBoolType();
        break;
    case glslang::EbtInt:
        spvType = builder.makeIntType(32);
        break;
    case glslang::EbtUint:
        spvType = builder.makeUintType(32);
        break;
    case glslang::EbtFloat:
        spvType = builder.makeFloatType(32);
        break;
    case glslang::EbtDouble:
        spvType = builder.makeFloatType(64);
        break;
    case glslang::EbtFloat16:
        spvType = builder.makeFloatType(16);
        break;
    case glslang::EbtInt8:
        spvType = builder.makeIntType(8);
        break;
    case glslang::EbtUint8:
        spvType = builder.makeUintType(8);
        break;
    case glslang::EbtInt16:
        spvType = builder.makeIntType(16);
        break;
    case glslang::EbtUint16:
        spvType = builder.makeUintType(16);
        break;
    case glslang::EbtInt64:
        spvType = builder.makeIntType(64);
        break;
    case glslang::EbtUint64:
        spvType = builder.makeUintType(64);
        break;
    case glslang::EbtAtomicUint:
        builder.addCapability(spv::CapabilityAtomicStorage);
        spvType = builder.makeUintType(32);
        break;
    case glslang::EbtAccStruct:
        switch (glslangIntermediate->getStage()) {
        case EShLangRayGen:
        case EShLangIntersect:
        case EShLangAnyHit:
        case EShLangClosestHit:
        case EShLangMiss:
        case EShLangCallable:
            // these all should have the RayTracingNV/KHR capability already
            break;
        default:
            {
                auto& extensions = glslangIntermediate->getRequestedExtensions();
                if (extensions.find("GL_EXT_ray_query") != extensions.end()) {
                    builder.addExtension(spv::E_SPV_KHR_ray_query);
                    builder.addCapability(spv::CapabilityRayQueryKHR);
                }
            }
            break;
        }
        spvType = builder.makeAccelerationStructureType();
        break;
    case glslang::EbtRayQuery:
        {
            auto& extensions = glslangIntermediate->getRequestedExtensions();
            if (extensions.find("GL_EXT_ray_query") != extensions.end()) {
                builder.addExtension(spv::E_SPV_KHR_ray_query);
                builder.addCapability(spv::CapabilityRayQueryKHR);
            }
            spvType = builder.makeRayQueryType();
        }
        break;
    case glslang::EbtReference:
        {
            // Make the forward pointer, then recurse to convert the structure type, then
            // patch up the forward pointer with a real pointer type.
            if (forwardPointers.find(type.getReferentType()) == forwardPointers.end()) {
                spv::Id forwardId = builder.makeForwardPointer(spv::StorageClassPhysicalStorageBufferEXT);
                forwardPointers[type.getReferentType()] = forwardId;
            }
            spvType = forwardPointers[type.getReferentType()];
            if (!forwardReferenceOnly) {
                spv::Id referentType = convertGlslangToSpvType(*type.getReferentType());
                builder.makePointerFromForwardPointer(spv::StorageClassPhysicalStorageBufferEXT,
                                                      forwardPointers[type.getReferentType()],
                                                      referentType);
            }
        }
        break;
    case glslang::EbtSampler:
        {
            const glslang::TSampler& sampler = type.getSampler();
            if (sampler.isPureSampler()) {
                spvType = builder.makeSamplerType();
            } else {
                // an image is present, make its type
                spvType = builder.makeImageType(getSampledType(sampler), TranslateDimensionality(sampler),
                                                sampler.isShadow(), sampler.isArrayed(), sampler.isMultiSample(),
                                                sampler.isImageClass() ? 2 : 1, TranslateImageFormat(type));
                if (sampler.isCombined() &&
                    (!sampler.isBuffer() || glslangIntermediate->getSpv().spv < glslang::EShTargetSpv_1_6)) {
                    // Already has both image and sampler, make the combined type. Only combine sampler to
                    // buffer if before SPIR-V 1.6.
                    spvType = builder.makeSampledImageType(spvType);
                }
            }
        }
        break;
    case glslang::EbtStruct:
    case glslang::EbtBlock:
        {
            // If we've seen this struct type, return it
            const glslang::TTypeList* glslangMembers = type.getStruct();

            // Try to share structs for different layouts, but not yet for other
            // kinds of qualification (primarily not yet including interpolant qualification).
            if (! HasNonLayoutQualifiers(type, qualifier))
                spvType = structMap[explicitLayout][qualifier.layoutMatrix][glslangMembers];
            if (spvType != spv::NoResult)
                break;

            // else, we haven't seen it...
            if (type.getBasicType() == glslang::EbtBlock)
                memberRemapper[glslangTypeToIdMap[glslangMembers]].resize(glslangMembers->size());
            spvType = convertGlslangStructToSpvType(type, glslangMembers, explicitLayout, qualifier);
        }
        break;
    case glslang::EbtString:
        // no type used for OpString
        return 0;

    case glslang::EbtHitObjectNV: {
        builder.addExtension(spv::E_SPV_NV_shader_invocation_reorder);
        builder.addCapability(spv::CapabilityShaderInvocationReorderNV);
        spvType = builder.makeHitObjectNVType();
    }
    break;
    case glslang::EbtSpirvType: {
        // GL_EXT_spirv_intrinsics
        const auto& spirvType = type.getSpirvType();
        const auto& spirvInst = spirvType.spirvInst;

        std::vector<spv::IdImmediate> operands;
        for (const auto& typeParam : spirvType.typeParams) {
            if (typeParam.getAsConstant() != nullptr) {
                // Constant expression
                auto constant = typeParam.getAsConstant();
                if (constant->isLiteral()) {
                    if (constant->getBasicType() == glslang::EbtFloat) {
                        float floatValue = static_cast<float>(constant->getConstArray()[0].getDConst());
                        unsigned literal;
                        static_assert(sizeof(literal) == sizeof(floatValue), "sizeof(unsigned) != sizeof(float)");
                        memcpy(&literal, &floatValue, sizeof(literal));
                        operands.push_back({false, literal});
                    } else if (constant->getBasicType() == glslang::EbtInt) {
                        unsigned literal = constant->getConstArray()[0].getIConst();
                        operands.push_back({false, literal});
                    } else if (constant->getBasicType() == glslang::EbtUint) {
                        unsigned literal = constant->getConstArray()[0].getUConst();
                        operands.push_back({false, literal});
                    } else if (constant->getBasicType() == glslang::EbtBool) {
                        unsigned literal = constant->getConstArray()[0].getBConst();
                        operands.push_back({false, literal});
                    } else if (constant->getBasicType() == glslang::EbtString) {
                        auto str = constant->getConstArray()[0].getSConst()->c_str();
                        unsigned literal = 0;
                        char* literalPtr = reinterpret_cast<char*>(&literal);
                        unsigned charCount = 0;
                        char ch = 0;
                        do {
                            ch = *(str++);
                            *(literalPtr++) = ch;
                            ++charCount;
                            if (charCount == 4) {
                                operands.push_back({false, literal});
                                literalPtr = reinterpret_cast<char*>(&literal);
                                charCount = 0;
                            }
                        } while (ch != 0);

                        // Partial literal is padded with 0
                        if (charCount > 0) {
                            for (; charCount < 4; ++charCount)
                                *(literalPtr++) = 0;
                            operands.push_back({false, literal});
                        }
                    } else
                        assert(0); // Unexpected type
                } else
                    operands.push_back({true, createSpvConstant(*constant)});
            } else {
                // Type specifier
                assert(typeParam.getAsType() != nullptr);
                operands.push_back({true, convertGlslangToSpvType(*typeParam.getAsType())});
            }
        }

        assert(spirvInst.set == ""); // Currently, couldn't be extended instructions.
        spvType = builder.makeGenericType(static_cast<spv::Op>(spirvInst.id), operands);

        break;
    }
    case glslang::EbtTensorLayoutNV:
    {
        builder.addCapability(spv::CapabilityTensorAddressingNV);
        builder.addExtension(spv::E_SPV_NV_tensor_addressing);

        std::vector<spv::IdImmediate> operands;
        for (uint32_t i = 0; i < 2; ++i) {
            operands.push_back({true, makeArraySizeId(*type.getTypeParameters()->arraySizes, i, true)});
        }
        spvType = builder.makeGenericType(spv::OpTypeTensorLayoutNV, operands);
        break;
    }
    case glslang::EbtTensorViewNV:
    {
        builder.addCapability(spv::CapabilityTensorAddressingNV);
        builder.addExtension(spv::E_SPV_NV_tensor_addressing);

        uint32_t dim = type.getTypeParameters()->arraySizes->getDimSize(0);
        assert(dim >= 1 && dim <= 5);
        std::vector<spv::IdImmediate> operands;
        for (uint32_t i = 0; i < dim + 2; ++i) {
            operands.push_back({true, makeArraySizeId(*type.getTypeParameters()->arraySizes, i, true, i==1)});
        }
        spvType = builder.makeGenericType(spv::OpTypeTensorViewNV, operands);
        break;
    }
    default:
        assert(0);
        break;
    }

    if (type.isMatrix())
        spvType = builder.makeMatrixType(spvType, type.getMatrixCols(), type.getMatrixRows());
    else {
        // If this variable has a vector element count greater than 1, create a SPIR-V vector
        if (type.getVectorSize() > 1)
            spvType = builder.makeVectorType(spvType, type.getVectorSize());
    }

    if (type.isCoopMatNV()) {
        builder.addCapability(spv::CapabilityCooperativeMatrixNV);
        builder.addExtension(spv::E_SPV_NV_cooperative_matrix);

        if (type.getBasicType() == glslang::EbtFloat16)
            builder.addCapability(spv::CapabilityFloat16);
        if (type.getBasicType() == glslang::EbtUint8 ||
            type.getBasicType() == glslang::EbtInt8) {
            builder.addCapability(spv::CapabilityInt8);
        }

        spv::Id scope = makeArraySizeId(*type.getTypeParameters()->arraySizes, 1);
        spv::Id rows = makeArraySizeId(*type.getTypeParameters()->arraySizes, 2);
        spv::Id cols = makeArraySizeId(*type.getTypeParameters()->arraySizes, 3);

        spvType = builder.makeCooperativeMatrixTypeNV(spvType, scope, rows, cols);
    }

    if (type.isCoopMatKHR()) {
        builder.addCapability(spv::CapabilityCooperativeMatrixKHR);
        builder.addExtension(spv::E_SPV_KHR_cooperative_matrix);

        if (type.getBasicType() == glslang::EbtFloat16)
            builder.addCapability(spv::CapabilityFloat16);
        if (type.getBasicType() == glslang::EbtUint8 || type.getBasicType() == glslang::EbtInt8) {
            builder.addCapability(spv::CapabilityInt8);
        }

        spv::Id scope = makeArraySizeId(*type.getTypeParameters()->arraySizes, 0);
        spv::Id rows = makeArraySizeId(*type.getTypeParameters()->arraySizes, 1);
        spv::Id cols = makeArraySizeId(*type.getTypeParameters()->arraySizes, 2);
        spv::Id use = builder.makeUintConstant(type.getCoopMatKHRuse());

        spvType = builder.makeCooperativeMatrixTypeKHR(spvType, scope, rows, cols, use);
    }

    if (type.isCoopVecNV()) {
        builder.addCapability(spv::CapabilityCooperativeVectorNV);
        builder.addExtension(spv::E_SPV_NV_cooperative_vector);

        if (type.getBasicType() == glslang::EbtFloat16)
            builder.addCapability(spv::CapabilityFloat16);
        if (type.getBasicType() == glslang::EbtUint8 || type.getBasicType() == glslang::EbtInt8) {
            builder.addCapability(spv::CapabilityInt8);
        }

        spv::Id components = makeArraySizeId(*type.getTypeParameters()->arraySizes, 0);

        spvType = builder.makeCooperativeVectorTypeNV(spvType, components);
    }

    if (type.isArray()) {
        int stride = 0;  // keep this 0 unless doing an explicit layout; 0 will mean no decoration, no stride

        // Do all but the outer dimension
        if (type.getArraySizes()->getNumDims() > 1) {
            // We need to decorate array strides for types needing explicit layout, except blocks.
            if (explicitLayout != glslang::ElpNone && type.getBasicType() != glslang::EbtBlock) {
                // Use a dummy glslang type for querying internal strides of
                // arrays of arrays, but using just a one-dimensional array.
                glslang::TType simpleArrayType(type, 0); // deference type of the array
                while (simpleArrayType.getArraySizes()->getNumDims() > 1)
                    simpleArrayType.getArraySizes()->dereference();

                // Will compute the higher-order strides here, rather than making a whole
                // pile of types and doing repetitive recursion on their contents.
                stride = getArrayStride(simpleArrayType, explicitLayout, qualifier.layoutMatrix);
            }

            // make the arrays
            for (int dim = type.getArraySizes()->getNumDims() - 1; dim > 0; --dim) {
                spvType = builder.makeArrayType(spvType, makeArraySizeId(*type.getArraySizes(), dim), stride);
                if (stride > 0)
                    builder.addDecoration(spvType, spv::DecorationArrayStride, stride);
                stride *= type.getArraySizes()->getDimSize(dim);
            }
        } else {
            // single-dimensional array, and don't yet have stride

            // We need to decorate array strides for types needing explicit layout, except blocks.
            if (explicitLayout != glslang::ElpNone && type.getBasicType() != glslang::EbtBlock)
                stride = getArrayStride(type, explicitLayout, qualifier.layoutMatrix);
        }

        // Do the outer dimension, which might not be known for a runtime-sized array.
        // (Unsized arrays that survive through linking will be runtime-sized arrays)
        if (type.isSizedArray())
            spvType = builder.makeArrayType(spvType, makeArraySizeId(*type.getArraySizes(), 0), stride);
        else {
            if (!lastBufferBlockMember) {
                builder.addIncorporatedExtension("SPV_EXT_descriptor_indexing", spv::Spv_1_5);
                builder.addCapability(spv::CapabilityRuntimeDescriptorArrayEXT);
            }
            spvType = builder.makeRuntimeArray(spvType);
        }
        if (stride > 0)
            builder.addDecoration(spvType, spv::DecorationArrayStride, stride);
    }

    return spvType;
}